

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O3

void Sat_SolverWriteDimacs
               (sat_solver *p,char *pFileName,lit *assumpBegin,lit *assumpEnd,int incrementVars)

{
  clause cVar1;
  FILE *__stream;
  int **ppiVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((long)p->size < 1) {
    iVar5 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      if (p->levels[lVar7] == 0) {
        iVar5 = iVar5 + (uint)(p->assigns[lVar7] != '\x03');
      }
      lVar7 = lVar7 + 1;
    } while (p->size != lVar7);
  }
  __stream = _stdout;
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"wb");
  }
  if (__stream == (FILE *)0x0) {
    puts("Sat_SolverWriteDimacs(): Cannot open the ouput file.");
    return;
  }
  fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->size,
          (ulong)(((int)((ulong)((long)assumpEnd - (long)assumpBegin) >> 2) + iVar5 +
                   (p->Mem).nEntries[0] + (p->Mem).nEntries[1]) - 1));
  iVar5 = (p->Mem).iPage[0];
  if (-1 < iVar5) {
    ppiVar2 = (p->Mem).pPages;
    lVar7 = 0;
    do {
      piVar3 = ppiVar2[lVar7];
      if (2 < *piVar3) {
        uVar9 = 2;
        do {
          if ((lVar7 != 0) || ((int)uVar9 != 2)) {
            Sat_SolverClauseWriteDimacs((FILE *)__stream,(clause *)(piVar3 + uVar9),incrementVars);
            ppiVar2 = (p->Mem).pPages;
          }
          cVar1 = *(clause *)(piVar3 + uVar9);
          uVar8 = (int)uVar9 + (((uint)cVar1 & 1) + ((uint)cVar1 >> 0xb) + 2 & 0xfffffffe);
          uVar9 = (ulong)uVar8;
          piVar3 = ppiVar2[lVar7];
        } while ((int)uVar8 < *piVar3);
        iVar5 = (p->Mem).iPage[0];
      }
      lVar7 = lVar7 + 2;
    } while ((int)lVar7 <= iVar5);
  }
  iVar5 = p->size;
  if (0 < iVar5) {
    pcVar6 = " 0";
    if (incrementVars == 0) {
      pcVar6 = "";
    }
    lVar7 = 0;
    do {
      if ((p->levels[lVar7] == 0) && (p->assigns[lVar7] != '\x03')) {
        pcVar4 = "-";
        if (p->assigns[lVar7] != '\x01') {
          pcVar4 = "";
        }
        fprintf(__stream,"%s%d%s\n",pcVar4,(ulong)((uint)(0 < incrementVars) + (int)lVar7),pcVar6);
        iVar5 = p->size;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  pcVar6 = " 0";
  if (assumpBegin != assumpEnd && assumpBegin != (lit *)0x0) {
    if (incrementVars == 0) {
      pcVar6 = "";
    }
    do {
      pcVar4 = "-";
      if ((*assumpBegin & 1U) == 0) {
        pcVar4 = "";
      }
      fprintf(__stream,"%s%d%s\n",pcVar4,(ulong)((*assumpBegin >> 1) + (uint)(0 < incrementVars)),
              pcVar6);
      assumpBegin = (lit *)((uint *)assumpBegin + 1);
    } while (assumpBegin != assumpEnd);
  }
  fputc(10,__stream);
  if (pFileName == (char *)0x0) {
    return;
  }
  fclose(__stream);
  return;
}

Assistant:

void Sat_SolverWriteDimacs( sat_solver * p, char * pFileName, lit* assumpBegin, lit* assumpEnd, int incrementVars )
{
    Sat_Mem_t * pMem = &p->Mem;
    FILE * pFile;
    clause * c;
    int i, k, nUnits;

    // count the number of unit clauses
    nUnits = 0;
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 )
            nUnits++;

    // start the file
    pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFile == NULL )
    {
        printf( "Sat_SolverWriteDimacs(): Cannot open the ouput file.\n" );
        return;
    }
//    fprintf( pFile, "c CNF generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->size, Sat_MemEntryNum(&p->Mem, 0)-1+Sat_MemEntryNum(&p->Mem, 1)+nUnits+(int)(assumpEnd-assumpBegin) );

    // write the original clauses
    Sat_MemForEachClause( pMem, c, i, k )
        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write the learned clauses
//    Sat_MemForEachLearned( pMem, c, i, k )
//        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write zero-level assertions
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 ) // varX
            fprintf( pFile, "%s%d%s\n",
                     (p->assigns[i] == 1)? "-": "",    // var0
                     i + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");

    // write the assump
    if (assumpBegin) {
        for (; assumpBegin != assumpEnd; assumpBegin++) {
            fprintf( pFile, "%s%d%s\n",
                     lit_sign(*assumpBegin)? "-": "",
                     lit_var(*assumpBegin) + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");
        }
    }

    fprintf( pFile, "\n" );
    if ( pFileName ) fclose( pFile );
}